

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O0

int twin_messenger_subscribe
              (TWIN_MESSENGER_HANDLE twin_msgr_handle,
              TWIN_STATE_UPDATE_CALLBACK on_twin_state_update_callback,void *context)

{
  LOGGER_LOG p_Var1;
  TWIN_MESSENGER_INSTANCE_conflict *twin_msgr;
  LOGGER_LOG l;
  int result;
  void *context_local;
  TWIN_STATE_UPDATE_CALLBACK on_twin_state_update_callback_local;
  TWIN_MESSENGER_HANDLE twin_msgr_handle_local;
  
  if ((twin_msgr_handle == (TWIN_MESSENGER_HANDLE)0x0) ||
     (on_twin_state_update_callback == (TWIN_STATE_UPDATE_CALLBACK)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"twin_messenger_subscribe",0x757,1,
                "Invalid argument (twin_msgr_handle=%p, on_twin_state_update_callback=%p)",
                twin_msgr_handle,on_twin_state_update_callback);
    }
    l._4_4_ = 0x758;
  }
  else {
    if (twin_msgr_handle->subscription_state == TWIN_SUBSCRIPTION_STATE_NOT_SUBSCRIBED) {
      twin_msgr_handle->on_message_received_callback = on_twin_state_update_callback;
      twin_msgr_handle->on_message_received_context = context;
      twin_msgr_handle->subscription_state = TWIN_SUBSCRIPTION_STATE_GET_COMPLETE_PROPERTIES;
    }
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

int twin_messenger_subscribe(TWIN_MESSENGER_HANDLE twin_msgr_handle, TWIN_STATE_UPDATE_CALLBACK on_twin_state_update_callback, void* context)
{
    int result;

    if (twin_msgr_handle == NULL || on_twin_state_update_callback == NULL)
    {
        LogError("Invalid argument (twin_msgr_handle=%p, on_twin_state_update_callback=%p)", twin_msgr_handle, on_twin_state_update_callback);
        result = MU_FAILURE;
    }
    else
    {
        TWIN_MESSENGER_INSTANCE* twin_msgr = (TWIN_MESSENGER_INSTANCE*)twin_msgr_handle;

        if (twin_msgr->subscription_state != TWIN_SUBSCRIPTION_STATE_NOT_SUBSCRIBED)
        {
            result = RESULT_OK;
        }
        else
        {
            twin_msgr->on_message_received_callback = on_twin_state_update_callback;
            twin_msgr->on_message_received_context = context;
            twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_GET_COMPLETE_PROPERTIES;
            result = RESULT_OK;
        }
    }

    return result;
}